

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
spvtools::val::ConstructNames_abi_cxx11_
          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,val *this,ConstructType type)

{
  undefined1 local_78 [8];
  string exit_name;
  string header_name;
  string construct_name;
  ConstructType type_local;
  
  std::__cxx11::string::string((string *)(header_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(exit_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  switch((int)this) {
  case 1:
    std::__cxx11::string::operator=((string *)(header_name.field_2._M_local_buf + 8),"selection");
    std::__cxx11::string::operator=
              ((string *)(exit_name.field_2._M_local_buf + 8),"selection header");
    std::__cxx11::string::operator=((string *)local_78,"merge block");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)(header_name.field_2._M_local_buf + 8),"continue");
    std::__cxx11::string::operator=
              ((string *)(exit_name.field_2._M_local_buf + 8),"continue target");
    std::__cxx11::string::operator=((string *)local_78,"back-edge block");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)(header_name.field_2._M_local_buf + 8),"loop");
    std::__cxx11::string::operator=((string *)(exit_name.field_2._M_local_buf + 8),"loop header");
    std::__cxx11::string::operator=((string *)local_78,"merge block");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)(header_name.field_2._M_local_buf + 8),"case");
    std::__cxx11::string::operator=
              ((string *)(exit_name.field_2._M_local_buf + 8),"case entry block");
    std::__cxx11::string::operator=((string *)local_78,"case exit block");
    break;
  default:
    __assert_fail("1 == 0 && \"Not defined type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp"
                  ,0x1bd,
                  "std::tuple<std::string, std::string, std::string> spvtools::val::ConstructNames(ConstructType)"
                 );
  }
  std::make_tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&header_name.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&exit_name.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(exit_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(header_name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, std::string, std::string> ConstructNames(
    ConstructType type) {
  std::string construct_name, header_name, exit_name;

  switch (type) {
    case ConstructType::kSelection:
      construct_name = "selection";
      header_name = "selection header";
      exit_name = "merge block";
      break;
    case ConstructType::kLoop:
      construct_name = "loop";
      header_name = "loop header";
      exit_name = "merge block";
      break;
    case ConstructType::kContinue:
      construct_name = "continue";
      header_name = "continue target";
      exit_name = "back-edge block";
      break;
    case ConstructType::kCase:
      construct_name = "case";
      header_name = "case entry block";
      exit_name = "case exit block";
      break;
    default:
      assert(1 == 0 && "Not defined type");
  }

  return std::make_tuple(construct_name, header_name, exit_name);
}